

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_binding.cpp
# Opt level: O1

void lumeview::ImGui_NewFrame(void)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ImGuiIO *pIVar4;
  ivec4 *piVar5;
  long lVar6;
  int i;
  vec2 vVar7;
  
  if (g_FontTexture == 0) {
    ImGui_CreateDeviceObjects();
  }
  pIVar4 = ImGui::GetIO();
  piVar5 = WindowEventListener::viewport((WindowEventListener *)g_eventListener);
  iVar1 = (piVar5->field_0).field_0.w;
  iVar2 = (piVar5->field_0).field_0.y;
  (pIVar4->DisplaySize).x = (float)((piVar5->field_0).field_0.z - (piVar5->field_0).field_0.x);
  (pIVar4->DisplaySize).y = (float)(iVar1 - iVar2);
  (pIVar4->DisplayFramebufferScale).x = 1.0;
  (pIVar4->DisplayFramebufferScale).y = 1.0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  pIVar4->DeltaTime = (float)(lVar6 - _ZN8lumeviewL6g_TimeE_0) / 1e+09;
  _ZN8lumeviewL6g_TimeE_0 = lVar6;
  vVar7 = WindowEventListener::cursor_position((WindowEventListener *)g_eventListener);
  (pIVar4->MousePos).x = vVar7.field_0._0_4_;
  (pIVar4->MousePos).y = vVar7.field_0._4_4_;
  lVar6 = 0;
  do {
    bVar3 = WindowEventListener::mouse_button_is_down
                      ((WindowEventListener *)g_eventListener,(int)lVar6);
    pIVar4->MouseDown[lVar6] = bVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  ImGui::NewFrame();
  return;
}

Assistant:

void ImGui_NewFrame()
{
    if (!g_FontTexture)
        ImGui_CreateDeviceObjects();

    ImGuiIO& io = ImGui::GetIO();

    const glm::ivec4 vp = g_eventListener.viewport();
    io.DisplaySize = ImVec2(float(vp.z - vp.x), float(vp.w - vp.y));
	io.DisplayFramebufferScale = ImVec2(1.f, 1.f);


    // Setup time step
    const auto curTime =  clock::now();
    io.DeltaTime = chrono::duration <float> (curTime - g_Time).count();
    g_Time = curTime;

    // Setip mouse
	const glm::vec2 cursorPos = g_eventListener.cursor_position();
	io.MousePos = ImVec2(cursorPos.x, cursorPos.y);

    for (int i = 0; i < 3; i++)
        io.MouseDown[i] = g_eventListener.mouse_button_is_down (i);

    // // Update OS/hardware mouse cursor if imgui isn't drawing a software cursor
    // if ((io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange) == 0 && glfwGetInputMode(g_Window, GLFW_CURSOR) != GLFW_CURSOR_DISABLED)
    // {
    //     ImGuiMouseCursor cursor = ImGui::GetMouseCursor();
    //     if (io.MouseDrawCursor || cursor == ImGuiMouseCursor_None)
    //     {
    //         glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
    //     }
    //     else
    //     {
    //         glfwSetCursor(g_Window, g_MouseCursors[cursor] ? g_MouseCursors[cursor] : g_MouseCursors[ImGuiMouseCursor_Arrow]);
    //         glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
    //     }
    // }

    // // Gamepad navigation mapping [BETA]
    // memset(io.NavInputs, 0, sizeof(io.NavInputs));
    // if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)
    // {
    //     // Update gamepad inputs
    //     #define MAP_BUTTON(NAV_NO, BUTTON_NO)       { if (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS) io.NavInputs[NAV_NO] = 1.0f; }
    //     #define MAP_ANALOG(NAV_NO, AXIS_NO, V0, V1) { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); if (v > 1.0f) v = 1.0f; if (io.NavInputs[NAV_NO] < v) io.NavInputs[NAV_NO] = v; }
    //     int axes_count = 0, buttons_count = 0;
    //     const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
    //     const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
    //     MAP_BUTTON(ImGuiNavInput_Activate,   0);     // Cross / A
    //     MAP_BUTTON(ImGuiNavInput_Cancel,     1);     // Circle / B
    //     MAP_BUTTON(ImGuiNavInput_Menu,       2);     // Square / X
    //     MAP_BUTTON(ImGuiNavInput_Input,      3);     // Triangle / Y
    //     MAP_BUTTON(ImGuiNavInput_DpadLeft,   13);    // D-Pad Left
    //     MAP_BUTTON(ImGuiNavInput_DpadRight,  11);    // D-Pad Right
    //     MAP_BUTTON(ImGuiNavInput_DpadUp,     10);    // D-Pad Up
    //     MAP_BUTTON(ImGuiNavInput_DpadDown,   12);    // D-Pad Down
    //     MAP_BUTTON(ImGuiNavInput_FocusPrev,  4);     // L1 / LB
    //     MAP_BUTTON(ImGuiNavInput_FocusNext,  5);     // R1 / RB
    //     MAP_BUTTON(ImGuiNavInput_TweakSlow,  4);     // L1 / LB
    //     MAP_BUTTON(ImGuiNavInput_TweakFast,  5);     // R1 / RB
    //     MAP_ANALOG(ImGuiNavInput_LStickLeft, 0,  -0.3f,  -0.9f);
    //     MAP_ANALOG(ImGuiNavInput_LStickRight,0,  +0.3f,  +0.9f);
    //     MAP_ANALOG(ImGuiNavInput_LStickUp,   1,  +0.3f,  +0.9f);
    //     MAP_ANALOG(ImGuiNavInput_LStickDown, 1,  -0.3f,  -0.9f);
    //     #undef MAP_BUTTON
    //     #undef MAP_ANALOG
    //     if (axes_count > 0 && buttons_count > 0) 
    //         io.BackendFlags |= ImGuiBackendFlags_HasGamepad; 
    //     else 
    //         io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
    // }

    // Start the frame. This call will update the io.WantCaptureMouse, io.WantCaptureKeyboard flag that you can use to dispatch inputs (or not) to your application.
    ImGui::NewFrame();
}